

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockUnix.cxx
# Opt level: O0

cmFileLockResult __thiscall cmFileLock::LockWithoutTimeout(cmFileLock *this)

{
  int iVar1;
  cmFileLock *this_local;
  
  iVar1 = LockFile(this,7,1);
  if (iVar1 == -1) {
    this_local = (cmFileLock *)cmFileLockResult::MakeSystem();
  }
  else {
    this_local = (cmFileLock *)cmFileLockResult::MakeOk();
  }
  return (cmFileLockResult)this_local;
}

Assistant:

cmFileLockResult cmFileLock::LockWithoutTimeout()
{
  if (this->LockFile(F_SETLKW, F_WRLCK) == -1) {
    return cmFileLockResult::MakeSystem();
  }
  return cmFileLockResult::MakeOk();
}